

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

Object * flatbuffers::GetUnionType(Schema *schema,Object *parent,Field *unionfield,Table *table)

{
  byte key;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this;
  Type *pTVar1;
  char *pcVar2;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_00;
  String *this_01;
  return_type field;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_02;
  return_type this_03;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_04;
  return_type pOVar3;
  int __c;
  int __c_00;
  return_type enumval;
  uchar union_type;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  return_type local_38;
  return_type type_field;
  return_type enumdef;
  Table *table_local;
  Field *unionfield_local;
  Object *parent_local;
  Schema *schema_local;
  
  enumdef = (return_type)table;
  table_local = &unionfield->super_Table;
  unionfield_local = (Field *)parent;
  parent_local = (Object *)schema;
  this = reflection::Schema::enums(schema);
  pTVar1 = reflection::Field::type((Field *)table_local);
  pcVar2 = reflection::Type::index(pTVar1,(char *)parent,__c);
  type_field = (return_type)
               Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this,(uint)pcVar2);
  this_00 = reflection::Object::fields((Object *)unionfield_local);
  this_01 = reflection::Field::name((Field *)table_local);
  String::str_abi_cxx11_(&local_78,this_01);
  pcVar2 = UnionTypeFieldSuffix();
  std::operator+(&local_58,&local_78,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  field = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                    ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_00,pcVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_38 = field;
  if (field != (return_type)0x0) {
    key = GetFieldI<unsigned_char>(&enumdef->super_Table,field);
    this_02 = reflection::Enum::values((Enum *)type_field);
    pcVar2 = (char *)(ulong)key;
    this_03 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
              LookupByKey<unsigned_char>(this_02,key);
    this_04 = reflection::Schema::objects((Schema *)parent_local);
    pTVar1 = reflection::EnumVal::union_type(this_03);
    pcVar2 = reflection::Type::index(pTVar1,pcVar2,__c_00);
    pOVar3 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                       (this_04,(uint)pcVar2);
    return pOVar3;
  }
  __assert_fail("type_field",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/reflection.h"
                ,0x1ac,
                "const reflection::Object &flatbuffers::GetUnionType(const reflection::Schema &, const reflection::Object &, const reflection::Field &, const Table &)"
               );
}

Assistant:

inline const reflection::Object &GetUnionType(
    const reflection::Schema &schema, const reflection::Object &parent,
    const reflection::Field &unionfield, const Table &table) {
  auto enumdef = schema.enums()->Get(unionfield.type()->index());
  // TODO: this is clumsy and slow, but no other way to find it?
  auto type_field = parent.fields()->LookupByKey(
      (unionfield.name()->str() + UnionTypeFieldSuffix()).c_str());
  FLATBUFFERS_ASSERT(type_field);
  auto union_type = GetFieldI<uint8_t>(table, *type_field);
  auto enumval = enumdef->values()->LookupByKey(union_type);
  return *schema.objects()->Get(enumval->union_type()->index());
}